

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseDriveFormal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_Bundle_t *pBundle0)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pObj;
  char *__s2;
  Abc_Obj_t *pAVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  long lVar12;
  Abc_Ntk_t *pBundle;
  ulong uVar13;
  char Buffer [200];
  char local_f8 [200];
  
  iVar2 = pBundle0->vNetsActual->nSize;
  if (0 < iVar2) {
    uVar13 = 0;
    do {
      if (iVar2 == 1) {
        strcpy(local_f8,pBundle0->pNameFormal);
      }
      else {
        sprintf(local_f8,"%s[%d]",pBundle0->pNameFormal,uVar13);
      }
      pAVar4 = Abc_NtkFindNet(pNtk,local_f8);
      if (pAVar4 != (Abc_Obj_t *)0x0) {
        __assert_fail("Abc_NtkFindNet( pNtk, Buffer ) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa00,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      pAVar4 = Abc_NtkFindOrCreateNet(pNtk,local_f8);
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      iVar2 = pNtk->vBoxes->nSize;
      if (1 < iVar2) {
        __assert_fail("Abc_NtkBoxNum(pNtk) <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa04,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      if (iVar2 == 0) {
        pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX);
      }
      else {
        if (iVar2 != 1) {
LAB_00351458:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar6 = (Abc_Obj_t *)*pNtk->vBoxes->pArray;
      }
      pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      Abc_ObjAddFanin(pObj,pAVar4);
      Abc_ObjAddFanin(pAVar4,pAVar5);
      Abc_ObjAddFanin(pAVar5,pAVar6);
      uVar9 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar9;
      iVar2 = pBundle0->vNetsActual->nSize;
    } while ((int)uVar9 < iVar2);
  }
  __s2 = Extra_UtilStrsav(pBundle0->pNameFormal);
  pvVar11 = pNtk->pData;
  if (0 < *(int *)((long)pvVar11 + 4)) {
    lVar8 = 0;
    pBundle = (Abc_Ntk_t *)0x0;
    do {
      pAVar4 = *(Abc_Obj_t **)(*(long *)((long)pvVar11 + 8) + lVar8 * 8);
      pAVar5 = (pAVar4->field_6).pCopy;
      iVar2 = *(int *)((long)&pAVar5->pNtk + 4);
      uVar13 = (ulong)(iVar2 - 1U);
      iVar10 = iVar2;
      if (iVar2 < 1) {
LAB_00351320:
        if (pBundle == (Abc_Ntk_t *)0x0) {
          __assert_fail("pBundle",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                        ,0xa17,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)")
          ;
        }
        iVar2 = *(int *)(pBundle->pName + 4);
        lVar12 = (long)iVar2;
        if (0 < lVar12) {
          lVar7 = 0;
          do {
            if (0 < *(int *)(*(long *)(*(long *)(pBundle->pName + 8) + lVar7 * 8) + 0x1c)) {
              sprintf(pMan->sError,"Missing specification of the I/Os of undefined box \"%s\".",
                      pNtk->pName);
              Ver_ParsePrintErrorMessage(pMan);
              return 0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar12 != lVar7);
          if (0 < iVar2) {
            do {
              if (*(int *)(pBundle->pName + 4) < lVar12) goto LAB_00351458;
              pAVar5 = *(Abc_Obj_t **)(*(long *)(pBundle->pName + 8) + (lVar12 + -1) * 8);
              pAVar6 = Abc_NtkCreateObj(pAVar5->pNtk,ABC_OBJ_BO);
              Abc_ObjAddFanin(pAVar6,pAVar4);
              Abc_ObjAddFanin(pAVar5,pAVar6);
              bVar1 = 1 < lVar12;
              lVar12 = lVar12 + -1;
            } while (bVar1);
          }
        }
        Ver_ParseFreeBundle((Ver_Bundle_t *)pBundle);
        if ((iVar10 < 1) || (*(int *)((long)&((pAVar4->field_6).pCopy)->pNtk + 4) < iVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        (&((pAVar4->field_6).pCopy)->pNext->pNtk)[uVar13 & 0xffffffff] = (Abc_Ntk_t *)0x0;
        pvVar11 = pNtk->pData;
        pBundle = (Abc_Ntk_t *)0x0;
      }
      else {
        uVar13 = (ulong)(iVar2 - 1U);
        do {
          if (iVar2 < iVar10) goto LAB_00351458;
          pBundle = (&pAVar5->pNext->pNtk)[uVar13];
          if ((pBundle != (Abc_Ntk_t *)0x0) &&
             (iVar3 = strcmp(*(char **)&pBundle->ntkType,__s2), iVar3 == 0)) goto LAB_00351311;
          iVar10 = (int)uVar13;
          bVar1 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar1);
        uVar13 = 0xffffffff;
        iVar10 = 0;
LAB_00351311:
        if ((int)uVar13 != iVar2) goto LAB_00351320;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)((long)pvVar11 + 4));
  }
  if (__s2 != (char *)0x0) {
    free(__s2);
  }
  return 1;
}

Assistant:

int Ver_ParseDriveFormal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_Bundle_t * pBundle0 )
{
    char Buffer[200];
    char * pName;
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pTerm, * pTermNew, * pNetAct, * pNetFormal;
    int k, j, m;

    // drive this net in the undef box
    Vec_PtrForEachEntry( Abc_Obj_t *, pBundle0->vNetsActual, pNetAct, m )
    {
        // create the formal net
        if ( Vec_PtrSize(pBundle0->vNetsActual) == 1 )
            sprintf( Buffer, "%s", pBundle0->pNameFormal );
        else
            sprintf( Buffer, "%s[%d]", pBundle0->pNameFormal, m );
        assert( Abc_NtkFindNet( pNtk, Buffer ) == NULL );
        pNetFormal = Abc_NtkFindOrCreateNet( pNtk, Buffer );
        // connect it to the box
        pTerm = Abc_NtkCreateBo( pNtk );
        assert( Abc_NtkBoxNum(pNtk) <= 1 );
        pBox = Abc_NtkBoxNum(pNtk)? Abc_NtkBox(pNtk,0) : Abc_NtkCreateBlackbox(pNtk);
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNetFormal );
        Abc_ObjAddFanin( pNetFormal, pTerm );
        Abc_ObjAddFanin( pTerm, pBox );
    }

    // go through instances of this type
    pName = Extra_UtilStrsav(pBundle0->pNameFormal);
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pName ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if any nets are driven in this bundle
        assert(pBundle); // Verify pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
            if ( Abc_ObjFaninNum(pNetAct) > 0 )
            {
                sprintf( pMan->sError, "Missing specification of the I/Os of undefined box \"%s\".", Abc_NtkName(pNtk) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
        // drive the nets by the undef box
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
        {
            pTermNew = Abc_NtkCreateBo( pNetAct->pNtk );
            Abc_ObjAddFanin( pTermNew, pBox );
            Abc_ObjAddFanin( pNetAct, pTermNew );
        }
        // remove the bundle
        Ver_ParseFreeBundle( pBundle ); pBundle = NULL;
        Vec_PtrWriteEntry( (Vec_Ptr_t *)pBox->pCopy, j, NULL );
    }
    ABC_FREE( pName );
    return 1;
}